

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetMetaDataBind<(duckdb::ParquetMetadataOperatorType)4>
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> _Var1;
  __uniq_ptr_impl<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
  _Var2;
  _Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false> _Var3;
  undefined8 uVar4;
  reference pvVar5;
  pointer pPVar6;
  pointer pPVar7;
  pointer pMVar8;
  InvalidInputException *this_00;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
  local_b8;
  _Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false> local_b0;
  undefined1 local_a8 [64];
  LogicalType local_68 [24];
  string local_50 [32];
  
  make_uniq<duckdb::ParquetMetaDataBindData>();
  make_uniq<duckdb::ParquetBloomProbeBindData>();
  pvVar5 = vector<duckdb::Value,_true>::get<true>(*(vector<duckdb::Value,_true> **)input,1);
  if (pvVar5[0x18] == (value_type)0x0) {
    pvVar5 = vector<duckdb::Value,_true>::get<true>(*(vector<duckdb::Value,_true> **)input,2);
    if (pvVar5[0x18] != (value_type)0x1) {
      pvVar5 = vector<duckdb::Value,_true>::get<true>(*(vector<duckdb::Value,_true> **)input,1);
      duckdb::LogicalType::LogicalType(local_68,VARCHAR);
      duckdb::Value::CastAs((ClientContext *)local_a8,(LogicalType *)pvVar5,SUB81(context,0));
      duckdb::Value::GetValue<std::__cxx11::string>();
      pPVar6 = unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
                             *)&local_b0);
      std::__cxx11::string::operator=((string *)&pPVar6->probe_column_name,local_50);
      std::__cxx11::string::~string(local_50);
      duckdb::Value::~Value((Value *)local_a8);
      duckdb::LogicalType::~LogicalType(local_68);
      pvVar5 = vector<duckdb::Value,_true>::get<true>(*(vector<duckdb::Value,_true> **)input,2);
      pPVar6 = unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
                             *)&local_b0);
      duckdb::Value::operator=(&pPVar6->probe_constant,pvVar5);
      _Var3._M_head_impl = local_b0._M_head_impl;
      _Var2._M_t.
      super__Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
      .super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl =
           local_b8._M_t.
           super__Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
           .super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl;
      local_b0._M_head_impl = (ParquetBloomProbeBindData *)0x0;
      local_b8._M_t.
      super__Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
      .super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl =
           (tuple<duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
            )(tuple<duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
              )_Var3._M_head_impl;
      if ((_Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
           )_Var2._M_t.
            super__Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
            .super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl !=
          (ParquetBloomProbeBindData *)0x0) {
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
                              .super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>.
                              _M_head_impl + 8))();
      }
      ParquetMetaDataOperatorData::BindBloomProbe(return_types,names);
      if (local_b0._M_head_impl != (ParquetBloomProbeBindData *)0x0) {
        (**(code **)(*(long *)&(local_b0._M_head_impl)->super_ParquetMetaDataBindData + 8))();
      }
      pPVar7 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_b8);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(pPVar7->return_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &return_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      duckdb::MultiFileReader::Create((TableFunction *)local_a8);
      pPVar7 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_b8);
      uVar4 = local_a8._0_8_;
      local_a8._0_8_ = (element_type *)0x0;
      _Var1._M_head_impl =
           (pPVar7->multi_file_reader).
           super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
           .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl;
      (pPVar7->multi_file_reader).
      super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
      super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
      .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl =
           (MultiFileReader *)uVar4;
      if (_Var1._M_head_impl != (MultiFileReader *)0x0) {
        (**(code **)(*(long *)_Var1._M_head_impl + 8))();
        if ((element_type *)local_a8._0_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_a8._0_8_ + 8))();
        }
      }
      pPVar7 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_b8);
      pMVar8 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->(&pPVar7->multi_file_reader);
      vector<duckdb::Value,_true>::get<true>(*(vector<duckdb::Value,_true> **)input,0);
      duckdb::MultiFileReader::CreateFileList
                ((ClientContext *)local_a8,(Value *)pMVar8,SUB81(context,0));
      pPVar7 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_b8);
      shared_ptr<duckdb::MultiFileList,_true>::operator=
                (&pPVar7->file_list,(shared_ptr<duckdb::MultiFileList,_true> *)local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      *(tuple<duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
        *)this = local_b8._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
                 .super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)local_a8,"Can\'t have NULL parameters for parquet_bloom_probe",
             (allocator *)local_50);
  duckdb::InvalidInputException::InvalidInputException(this_00,(string *)local_a8);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> ParquetMetaDataBind(ClientContext &context, TableFunctionBindInput &input,
                                             vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<ParquetMetaDataBindData>();

	switch (TYPE) {
	case ParquetMetadataOperatorType::SCHEMA:
		ParquetMetaDataOperatorData::BindSchema(return_types, names);
		break;
	case ParquetMetadataOperatorType::META_DATA:
		ParquetMetaDataOperatorData::BindMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
		ParquetMetaDataOperatorData::BindKeyValueMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::FILE_META_DATA:
		ParquetMetaDataOperatorData::BindFileMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::BLOOM_PROBE: {
		auto probe_bind_data = make_uniq<ParquetBloomProbeBindData>();
		D_ASSERT(input.inputs.size() == 3);
		if (input.inputs[1].IsNull() || input.inputs[2].IsNull()) {
			throw InvalidInputException("Can't have NULL parameters for parquet_bloom_probe");
		}
		probe_bind_data->probe_column_name = input.inputs[1].CastAs(context, LogicalType::VARCHAR).GetValue<string>();
		probe_bind_data->probe_constant = input.inputs[2];
		result = std::move(probe_bind_data);
		ParquetMetaDataOperatorData::BindBloomProbe(return_types, names);
		break;
	}
	default:
		throw InternalException("Unsupported ParquetMetadataOperatorType");
	}

	result->return_types = return_types;
	result->multi_file_reader = MultiFileReader::Create(input.table_function);
	result->file_list = result->multi_file_reader->CreateFileList(context, input.inputs[0]);

	return std::move(result);
}